

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanNMTOKEN(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  Category CVar2;
  uint *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  QStringView s;
  
  lVar5 = 0;
  do {
    lVar3 = (this->putStack).tos;
    if (lVar3 == -1) {
      lVar3 = this->readBufferPos;
      if ((this->readBuffer).d.size <= lVar3) {
        uVar6 = getChar_helper(this);
        goto LAB_0039b9ad;
      }
      this->readBufferPos = lVar3 + 1;
      uVar6 = (uint)(ushort)(this->readBuffer).d.ptr[lVar3];
    }
    else {
      if (this->atEnd != false) goto LAB_0039b9ef;
      uVar6 = (this->putStack).data[lVar3];
      (this->putStack).tos = lVar3 + -1;
LAB_0039b9ad:
      if (uVar6 == 0xffffffff) {
LAB_0039b9ef:
        lVar3 = (this->textBuffer).d.size;
        lVar4 = lVar3 - lVar5;
        s.m_data = (this->textBuffer).d.ptr;
        s.m_size = lVar3;
        putString(this,s,lVar4);
        QString::resize(&this->textBuffer,lVar4);
        return lVar5;
      }
    }
    if ((uVar6 & 0xffff) < 0x80) {
      if ("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [uVar6 & 0x7f] == '\x02') goto LAB_0039ba1b;
    }
    else {
      CVar2 = QChar::category(uVar6 & 0xffff);
      if ((Letter_Other < CVar2) ||
         ((0x7c03fU >> (CVar2 & (Symbol_Modifier|Number_DecimalDigit)) & 1) == 0)) {
LAB_0039ba1b:
        __ptr = (this->putStack).data;
        lVar4 = (this->putStack).tos;
        lVar3 = lVar4 + 1;
        lVar1 = (this->putStack).cap;
        if (lVar1 <= lVar3) {
          lVar4 = lVar4 + 2;
          lVar3 = lVar1 * 2;
          if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar1 * -2 < 0) {
            lVar3 = lVar4;
          }
          (this->putStack).cap = lVar3;
          __ptr = (uint *)realloc(__ptr,lVar3 << 2);
          (this->putStack).data = __ptr;
          if (__ptr == (uint *)0x0) {
            qBadAlloc();
          }
          lVar3 = (this->putStack).tos + 1;
        }
        (this->putStack).tos = lVar3;
        __ptr[lVar3] = uVar6;
        return lVar5;
      }
    }
    lVar5 = lVar5 + 1;
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar6);
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanNMTOKEN()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (fastDetermineNameChar(QChar(c)) == NotName) {
            putChar(c);
            return n;
        } else {
            ++n;
            textBuffer += QChar(c);
        }
    }

    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);

    return n;
}